

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sx_strstr_wildcard(char *str,char *pattern)

{
  code *pcVar1;
  undefined1 uVar2;
  char *local_30;
  char *s;
  char *w;
  char *pattern_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x176,"str");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  if (pattern == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x177,"pattern");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  s = (char *)0x0;
  local_30 = (char *)0x0;
  w = pattern;
  pattern_local = str;
  while( true ) {
    while (*pattern_local != '\0') {
      if (w == (char *)0x0) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                          ,0x188,"pattern");
        pcVar1 = (code *)swi(3);
        uVar2 = (*pcVar1)();
        return (_Bool)uVar2;
      }
      if (*w == *pattern_local) {
        pattern_local = pattern_local + 1;
        w = w + 1;
      }
      else if (*w == '*') {
        s = w + 1;
        local_30 = pattern_local;
        w = s;
        if (*s == '\0') {
          return true;
        }
      }
      else {
        if (s == (char *)0x0) {
          return false;
        }
        pattern_local = pattern_local + 1;
      }
    }
    if (*w == '\0') {
      return true;
    }
    if (local_30 == (char *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                        ,0x181,"s");
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return (_Bool)uVar2;
    }
    if (*local_30 == '\0') break;
    pattern_local = local_30;
    w = s;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool sx_strstr_wildcard(const char* str, const char* pattern)
{
    sx_assert(str);
    sx_assert(pattern);

    const char* w = NULL;    // last `*`
    const char* s = NULL;    // last checked char

    // loop 1 char at a time
    while (1) {
        if (!*str) {
            if (!*pattern)
                return true;
            sx_assert(s);
            if (!*s)
                return false;
            str = s++;
            pattern = w;
            continue;
        } else {
            sx_assert(pattern);
            if (*pattern != *str) {
                if ('*' == *pattern) {
                    w = ++pattern;
                    s = str;
                    // "*" -> "foobar"
                    if (*pattern)
                        continue;
                    return true;
                } else if (w) {
                    str++;
                    // "*ooba*" -> "foobar"
                    continue;
                }
                return false;
            }
        }

        str++;
        pattern++;
    }

    return true;
}